

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void * __thiscall
ft::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::realloc(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,void *__ptr,size_t __size)

{
  pointer pbVar1;
  long lVar2;
  long *plVar3;
  pointer pbVar4;
  long *plVar5;
  void *extraout_RAX;
  size_type sVar6;
  long lVar7;
  ulong uVar8;
  
  sVar6 = (long)__ptr + (ulong)(__ptr == (void *)0x0);
  pbVar4 = (pointer)operator_new(sVar6 * 0x20);
  if (this->m_size != 0) {
    lVar7 = 0x10;
    uVar8 = 0;
    do {
      pbVar1 = this->m_data;
      *(long *)((long)pbVar4 + lVar7 + -0x10) = (long)&(pbVar4->_M_dataplus)._M_p + lVar7;
      lVar2 = *(long *)((long)pbVar1 + lVar7 + -0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)pbVar4 + lVar7 + -0x10),lVar2,
                 *(long *)((long)pbVar1 + lVar7 + -8) + lVar2);
      plVar3 = *(long **)((long)this->m_data + lVar7 + -0x10);
      plVar5 = (long *)((long)&(this->m_data->_M_dataplus)._M_p + lVar7);
      if (plVar5 != plVar3) {
        operator_delete(plVar3,*plVar5 + 1);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar8 < this->m_size);
  }
  operator_delete(this->m_data);
  this->m_data = pbVar4;
  this->m_capacity = sVar6;
  return extraout_RAX;
}

Assistant:

void	realloc(size_type newCapacity) {
		if (newCapacity == 0)
			newCapacity = 1;
		pointer	newBlock = this->get_allocator().allocate(newCapacity);
		for (size_type i = 0; i < this->size(); ++i)
		{
			this->get_allocator().construct(newBlock + i, this->m_data[i]);
			this->get_allocator().destroy(this->m_data + i);
		}
		this->get_allocator().deallocate(this->m_data, this->capacity());
		this->m_data = newBlock;
		this->m_capacity = newCapacity;
	}